

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uint64 value,uint8 *target)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = (uint)value;
  if (value >> 0x38 == 0) {
    uVar1 = (uint)(value >> 0x1c);
    if (uVar1 != 0) {
      if (0x3fff < uVar1) {
        lVar2 = 7;
        lVar3 = 8;
        if (0x1fffff < uVar1) goto LAB_001c8cbd;
        goto LAB_001c8ccd;
      }
      lVar2 = 6;
      lVar3 = 5;
      if (0x7f < uVar1) goto LAB_001c8cda;
      goto LAB_001c8cea;
    }
    if (0x3fff < uVar4) {
      lVar2 = 3;
      lVar3 = 4;
      if (0x1fffff < uVar4) goto LAB_001c8cef;
      goto LAB_001c8cfc;
    }
    lVar2 = 2;
    lVar3 = 1;
    if (uVar4 < 0x80) goto LAB_001c8d15;
  }
  else {
    lVar3 = 9;
    if ((long)value < 0) {
      target[9] = 0x81;
      lVar3 = 10;
    }
    target[8] = (byte)(value >> 0x38) | 0x80;
LAB_001c8cbd:
    lVar2 = lVar3;
    target[7] = (byte)(value >> 0x31) | 0x80;
LAB_001c8ccd:
    target[6] = (byte)(value >> 0x2a) | 0x80;
LAB_001c8cda:
    target[5] = (byte)(value >> 0x23) | 0x80;
    lVar3 = lVar2;
LAB_001c8cea:
    target[4] = (byte)(value >> 0x1c) | 0x80;
LAB_001c8cef:
    lVar2 = lVar3;
    target[3] = (byte)(value >> 0x15) | 0x80;
LAB_001c8cfc:
    target[2] = (byte)(value >> 0xe) | 0x80;
  }
  target[1] = (byte)(value >> 7) | 0x80;
  lVar3 = lVar2;
LAB_001c8d15:
  *target = (byte)value | 0x80;
  target[lVar3 + -1] = target[lVar3 + -1] & 0x7f;
  return target + lVar3;
}

Assistant:

inline uint8* CodedOutputStream::WriteVarint64ToArrayInline(
    uint64 value, uint8* target) {
  // Splitting into 32-bit pieces gives better performance on 32-bit
  // processors.
  uint32 part0 = static_cast<uint32>(value      );
  uint32 part1 = static_cast<uint32>(value >> 28);
  uint32 part2 = static_cast<uint32>(value >> 56);

  int size;

  // Here we can't really optimize for small numbers, since the value is
  // split into three parts.  Cheking for numbers < 128, for instance,
  // would require three comparisons, since you'd have to make sure part1
  // and part2 are zero.  However, if the caller is using 64-bit integers,
  // it is likely that they expect the numbers to often be very large, so
  // we probably don't want to optimize for small numbers anyway.  Thus,
  // we end up with a hardcoded binary search tree...
  if (part2 == 0) {
    if (part1 == 0) {
      if (part0 < (1 << 14)) {
        if (part0 < (1 << 7)) {
          size = 1; goto size1;
        } else {
          size = 2; goto size2;
        }
      } else {
        if (part0 < (1 << 21)) {
          size = 3; goto size3;
        } else {
          size = 4; goto size4;
        }
      }
    } else {
      if (part1 < (1 << 14)) {
        if (part1 < (1 << 7)) {
          size = 5; goto size5;
        } else {
          size = 6; goto size6;
        }
      } else {
        if (part1 < (1 << 21)) {
          size = 7; goto size7;
        } else {
          size = 8; goto size8;
        }
      }
    }
  } else {
    if (part2 < (1 << 7)) {
      size = 9; goto size9;
    } else {
      size = 10; goto size10;
    }
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";

  size10: target[9] = static_cast<uint8>((part2 >>  7) | 0x80);
  size9 : target[8] = static_cast<uint8>((part2      ) | 0x80);
  size8 : target[7] = static_cast<uint8>((part1 >> 21) | 0x80);
  size7 : target[6] = static_cast<uint8>((part1 >> 14) | 0x80);
  size6 : target[5] = static_cast<uint8>((part1 >>  7) | 0x80);
  size5 : target[4] = static_cast<uint8>((part1      ) | 0x80);
  size4 : target[3] = static_cast<uint8>((part0 >> 21) | 0x80);
  size3 : target[2] = static_cast<uint8>((part0 >> 14) | 0x80);
  size2 : target[1] = static_cast<uint8>((part0 >>  7) | 0x80);
  size1 : target[0] = static_cast<uint8>((part0      ) | 0x80);

  target[size-1] &= 0x7F;
  return target + size;
}